

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  OptionStatus OVar1;
  HighsLogOptions *in_RDX;
  string *in_RSI;
  OptionStatus return_status;
  string *in_stack_ffffffffffffff48;
  OptionRecordString *in_stack_ffffffffffffff50;
  OptionRecordString *this;
  HighsLogOptions *report_log_options_00;
  undefined1 local_78 [120];
  
  report_log_options_00 = in_RDX;
  local_78._96_8_ = in_RSI;
  std::__cxx11::string::string((string *)(local_78 + 0x30),(string *)in_RDX);
  OVar1 = checkOptionValue(report_log_options_00,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
                          );
  std::__cxx11::string::~string((string *)(local_78 + 0x30));
  local_78._116_4_ = OVar1;
  if (OVar1 == kOk) {
    this = (OptionRecordString *)local_78;
    local_78._84_4_ = OVar1;
    std::__cxx11::string::string((string *)this,(string *)in_RDX);
    OptionRecordString::assignvalue(this,(string *)local_78._96_8_);
    std::__cxx11::string::~string((string *)local_78);
    local_78._116_4_ = kOk;
  }
  return local_78._116_4_;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 OptionRecordString& option,
                                 const std::string value) {
  OptionStatus return_status =
      checkOptionValue(report_log_options, option, value);
  if (return_status != OptionStatus::kOk) return return_status;
  option.assignvalue(value);
  return OptionStatus::kOk;
}